

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O2

void __thiscall chrono::ChShaft::ChShaft(ChShaft *this,ChShaft *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChShaft_0116db58;
  (this->super_ChLoadable)._vptr_ChLoadable = (_func_int **)&PTR__ChShaft_0116dda0;
  ChVariablesShaft::ChVariablesShaft(&this->variables);
  (this->super_ChPhysicsItem).system = (other->super_ChPhysicsItem).system;
  dVar1 = other->pos;
  dVar2 = other->pos_dt;
  dVar3 = other->pos_dtdt;
  this->torque = other->torque;
  this->pos = dVar1;
  this->pos_dt = dVar2;
  this->pos_dtdt = dVar3;
  this->inertia = other->inertia;
  this->fixed = other->fixed;
  this->sleeping = other->sleeping;
  this->limitspeed = other->limitspeed;
  ChVariablesShaft::operator=(&this->variables,&other->variables);
  this->sleep_starttime = other->sleep_starttime;
  fVar4 = other->sleep_time;
  fVar5 = other->sleep_minspeed;
  fVar6 = other->sleep_minwvel;
  this->max_speed = other->max_speed;
  this->sleep_time = fVar4;
  this->sleep_minspeed = fVar5;
  this->sleep_minwvel = fVar6;
  return;
}

Assistant:

ChShaft::ChShaft(const ChShaft& other) : ChPhysicsItem(other) {
    torque = other.torque;
    system = other.system;
    pos = other.pos;
    pos_dt = other.pos_dt;
    pos_dtdt = other.pos_dtdt;
    inertia = other.inertia;
    fixed = other.fixed;
    sleeping = other.sleeping;
    limitspeed = other.limitspeed;

    variables = other.variables;

    max_speed = other.max_speed;

    sleep_time = other.sleep_time;
    sleep_starttime = other.sleep_starttime;
    sleep_minspeed = other.sleep_minspeed;
    sleep_minwvel = other.sleep_minwvel;
}